

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_timesplit_array.h
# Opt level: O3

void __thiscall
embree::sse2::
HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::sse2::GridRecalculatePrimRef,_2UL>::
TemporalBinInfo::bin
          (TemporalBinInfo *this,PrimRefMB *prims,size_t begin,size_t end,BBox1f time_range,
          SetMB *set,GridRecalculatePrimRef *recalculatePrimRef)

{
  undefined1 auVar1 [16];
  ushort uVar2;
  ushort uVar3;
  SubGridBuildData *pSVar4;
  Geometry *pGVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  undefined4 uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ushort uVar16;
  size_t y;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  undefined1 (*pauVar22) [16];
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  ushort uVar26;
  size_t y_2;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar35;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar36;
  undefined1 auVar37 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar38;
  undefined1 auVar39 [16];
  float fVar40;
  float fVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar44;
  undefined1 auVar45 [16];
  float fVar46;
  float fVar47;
  undefined1 auVar48 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar49;
  undefined1 auVar50 [16];
  float fVar51;
  float fVar52;
  undefined1 auVar53 [16];
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar59;
  float fVar60;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar61;
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar67;
  undefined1 auVar66 [16];
  float fVar69;
  undefined1 auVar68 [16];
  
  fVar27 = time_range.lower;
  fVar35 = time_range.upper;
  fVar47 = (set->super_PrimInfoMB).max_time_range.lower;
  fVar40 = (set->super_PrimInfoMB).max_time_range.upper - fVar47;
  fVar30 = (float)(set->super_PrimInfoMB).max_num_time_segments;
  fVar28 = roundf((((fVar27 * 0.5 + fVar35 * 0.5) - fVar47) / fVar40) * fVar30);
  fVar47 = (fVar28 / fVar30) * fVar40 + fVar47;
  if (begin < end && !(bool)(~(fVar27 < fVar47 && fVar47 < fVar35) & 1)) {
    do {
      fVar28 = prims[begin].time_range.upper * 0.9999;
      if ((fVar27 < fVar28) && (prims[begin].time_range.lower * 1.0001 < fVar47)) {
        fVar28 = prims[begin].lbounds.bounds0.upper.field_0.m128[3];
        pSVar4 = recalculatePrimRef->sgrids;
        pGVar5 = (recalculatePrimRef->scene->geometries).items
                 [(uint)prims[begin].lbounds.bounds0.lower.field_0.m128[3]].ptr;
        uVar24 = (ulong)pSVar4[(uint)fVar28].sx & 0x7fff;
        uVar17 = (ulong)pSVar4[(uint)fVar28].sy & 0x7fff;
        lVar6 = *(long *)&pGVar5->field_0x58;
        lVar25 = (ulong)pSVar4[(uint)fVar28].primID *
                 pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
        fVar28 = pGVar5->fnumTimeSegments;
        fVar30 = (pGVar5->time_range).lower;
        fVar36 = (pGVar5->time_range).upper - fVar30;
        fVar41 = (fVar27 - fVar30) / fVar36;
        fVar36 = (fVar47 - fVar30) / fVar36;
        fVar40 = fVar28 * fVar41;
        fVar51 = fVar28 * fVar36;
        fVar29 = floorf(fVar40);
        fVar30 = ceilf(fVar51);
        iVar21 = (int)fVar29;
        if (fVar29 <= 0.0) {
          fVar29 = 0.0;
        }
        if (iVar21 < 0) {
          iVar21 = -1;
        }
        iVar10 = (int)fVar28 + 1;
        if ((int)fVar30 < (int)fVar28 + 1) {
          iVar10 = (int)fVar30;
        }
        if (fVar28 <= fVar30) {
          fVar30 = fVar28;
        }
        uVar2 = *(ushort *)(lVar6 + 10 + lVar25);
        uVar15 = (ulong)uVar2;
        if (uVar17 + 3 < (ulong)uVar2) {
          uVar15 = uVar17 + 3;
        }
        uVar16 = (ushort)uVar17;
        uVar26 = (ushort)uVar24;
        auVar34 = _DAT_01f7a9f0;
        auVar37 = _DAT_01f7a9f0;
        auVar32 = _DAT_01f7aa00;
        auVar48 = _DAT_01f7aa00;
        auVar43 = _DAT_01f7aa00;
        auVar65 = _DAT_01f7a9f0;
        auVar58 = _DAT_01f7aa00;
        auVar64 = _DAT_01f7a9f0;
        if (uVar16 < uVar2) {
          uVar23 = uVar24 + 3;
          uVar3 = *(ushort *)(lVar6 + 8 + lVar25);
          uVar13 = (ulong)uVar3;
          if (uVar23 < uVar3) {
            uVar13 = uVar23;
          }
          uVar18 = uVar17;
          do {
            if (uVar26 < uVar3) {
              lVar19 = (long)(int)fVar29 * 0x38;
              lVar20 = *(long *)(*(long *)&pGVar5[2].numPrimitives + 0x10 + lVar19);
              uVar12 = *(uint *)(lVar6 + 4 + lVar25) * uVar18;
              pauVar22 = (undefined1 (*) [16])
                         ((*(uint *)(lVar6 + lVar25) + uVar24 + uVar12) * lVar20 +
                         *(long *)(*(long *)&pGVar5[2].numPrimitives + lVar19));
              lVar19 = uVar13 - uVar24;
              do {
                auVar42 = *pauVar22;
                auVar34._4_4_ = -(uint)(auVar42._4_4_ < 1.844e+18 && -1.844e+18 < auVar42._4_4_);
                auVar34._0_4_ = -(uint)(auVar42._0_4_ < 1.844e+18 && -1.844e+18 < auVar42._0_4_);
                auVar34._8_4_ = -(uint)(auVar42._8_4_ < 1.844e+18 && -1.844e+18 < auVar42._8_4_);
                auVar34._12_4_ = -(uint)(auVar42._12_4_ < 1.844e+18 && -1.844e+18 < auVar42._12_4_);
                uVar11 = movmskps((int)uVar12,auVar34);
                uVar12 = (ulong)CONCAT31((int3)((uint)uVar11 >> 8),~(byte)uVar11);
                auVar34 = _DAT_01f7a9f0;
                auVar32 = _DAT_01f7aa00;
                if ((~(byte)uVar11 & 7) != 0) goto LAB_00c98b94;
                auVar37 = minps(auVar37,auVar42);
                auVar48 = maxps(auVar48,auVar42);
                pauVar22 = (undefined1 (*) [16])(*pauVar22 + lVar20);
                lVar19 = lVar19 + -1;
              } while (lVar19 != 0);
            }
            uVar18 = uVar18 + 1;
            auVar34 = auVar37;
            auVar32 = auVar48;
          } while (uVar18 != uVar15);
LAB_00c98b94:
          lVar20 = (long)(int)fVar30 * 0x38;
          uVar18 = uVar17;
          auVar42 = _DAT_01f7a9f0;
          auVar53 = _DAT_01f7aa00;
          do {
            if (uVar26 < uVar3) {
              lVar19 = *(long *)(*(long *)&pGVar5[2].numPrimitives + 0x10 + lVar20);
              uVar12 = *(uint *)(lVar6 + 4 + lVar25) * uVar18;
              pauVar22 = (undefined1 (*) [16])
                         ((*(uint *)(lVar6 + lVar25) + uVar24 + uVar12) * lVar19 +
                         *(long *)(*(long *)&pGVar5[2].numPrimitives + lVar20));
              lVar14 = uVar13 - uVar24;
              do {
                auVar1 = *pauVar22;
                auVar37._0_4_ = -(uint)(auVar1._0_4_ < 1.844e+18 && -1.844e+18 < auVar1._0_4_);
                auVar37._4_4_ = -(uint)(auVar1._4_4_ < 1.844e+18 && -1.844e+18 < auVar1._4_4_);
                auVar37._8_4_ = -(uint)(auVar1._8_4_ < 1.844e+18 && -1.844e+18 < auVar1._8_4_);
                auVar37._12_4_ = -(uint)(auVar1._12_4_ < 1.844e+18 && -1.844e+18 < auVar1._12_4_);
                uVar11 = movmskps((int)uVar12,auVar37);
                uVar12 = (ulong)CONCAT31((int3)((uint)uVar11 >> 8),~(byte)uVar11);
                auVar37 = _DAT_01f7a9f0;
                auVar48 = _DAT_01f7aa00;
                if ((~(byte)uVar11 & 7) != 0) goto LAB_00c98c19;
                auVar42 = minps(auVar42,auVar1);
                auVar53 = maxps(auVar53,auVar1);
                pauVar22 = (undefined1 (*) [16])(*pauVar22 + lVar19);
                lVar14 = lVar14 + -1;
              } while (lVar14 != 0);
            }
            uVar18 = uVar18 + 1;
            auVar37 = auVar42;
            auVar48 = auVar53;
          } while (uVar18 != uVar15);
LAB_00c98c19:
          if (iVar10 - iVar21 == 1) goto LAB_00c98c2c;
          if (uVar16 < uVar2) {
            uVar3 = *(ushort *)(lVar6 + 8 + lVar25);
            uVar13 = (ulong)uVar3;
            if (uVar23 < uVar3) {
              uVar13 = uVar23;
            }
            uVar23 = uVar17;
            do {
              uVar18 = uVar17;
              auVar42 = _DAT_01f7aa00;
              auVar53 = _DAT_01f7a9f0;
              if (uVar26 < uVar3) {
                lVar14 = (long)(int)fVar29 * 0x38;
                lVar19 = *(long *)(*(long *)&pGVar5[2].numPrimitives + 0x48 + lVar14);
                uVar12 = *(uint *)(lVar6 + 4 + lVar25) * uVar23;
                pauVar22 = (undefined1 (*) [16])
                           ((*(uint *)(lVar6 + lVar25) + uVar24 + uVar12) * lVar19 +
                           *(long *)(*(long *)&pGVar5[2].numPrimitives + 0x38 + lVar14));
                lVar14 = uVar13 - uVar24;
                do {
                  auVar1 = *pauVar22;
                  auVar65._0_4_ = -(uint)(auVar1._0_4_ < 1.844e+18 && -1.844e+18 < auVar1._0_4_);
                  auVar65._4_4_ = -(uint)(auVar1._4_4_ < 1.844e+18 && -1.844e+18 < auVar1._4_4_);
                  auVar65._8_4_ = -(uint)(auVar1._8_4_ < 1.844e+18 && -1.844e+18 < auVar1._8_4_);
                  auVar65._12_4_ = -(uint)(auVar1._12_4_ < 1.844e+18 && -1.844e+18 < auVar1._12_4_);
                  uVar11 = movmskps((int)uVar12,auVar65);
                  uVar12 = (ulong)CONCAT31((int3)((uint)uVar11 >> 8),~(byte)uVar11);
                  auVar65 = _DAT_01f7a9f0;
                  auVar43 = _DAT_01f7aa00;
                  if ((~(byte)uVar11 & 7) != 0) goto LAB_00c98d7b;
                  auVar64 = minps(auVar64,auVar1);
                  auVar58 = maxps(auVar58,auVar1);
                  pauVar22 = (undefined1 (*) [16])(*pauVar22 + lVar19);
                  lVar14 = lVar14 + -1;
                } while (lVar14 != 0);
              }
              uVar23 = uVar23 + 1;
              auVar65 = auVar64;
              auVar43 = auVar58;
            } while (uVar23 != uVar15);
LAB_00c98d7b:
            do {
              if (uVar26 < uVar3) {
                lVar19 = *(long *)(*(long *)&pGVar5[2].numPrimitives + -0x28 + lVar20);
                uVar23 = *(uint *)(lVar6 + 4 + lVar25) * uVar18;
                pauVar22 = (undefined1 (*) [16])
                           ((*(uint *)(lVar6 + lVar25) + uVar24 + uVar23) * lVar19 +
                           *(long *)(*(long *)&pGVar5[2].numPrimitives + -0x38 + lVar20));
                lVar14 = uVar13 - uVar24;
                do {
                  auVar1 = *pauVar22;
                  auVar58._4_4_ = -(uint)(auVar1._4_4_ < 1.844e+18 && -1.844e+18 < auVar1._4_4_);
                  auVar58._0_4_ = -(uint)(auVar1._0_4_ < 1.844e+18 && -1.844e+18 < auVar1._0_4_);
                  auVar58._8_4_ = -(uint)(auVar1._8_4_ < 1.844e+18 && -1.844e+18 < auVar1._8_4_);
                  auVar58._12_4_ = -(uint)(auVar1._12_4_ < 1.844e+18 && -1.844e+18 < auVar1._12_4_);
                  uVar11 = movmskps((int)uVar23,auVar58);
                  uVar23 = (ulong)CONCAT31((int3)((uint)uVar11 >> 8),~(byte)uVar11);
                  auVar58 = _DAT_01f7aa00;
                  auVar64 = _DAT_01f7a9f0;
                  if ((~(byte)uVar11 & 7) != 0) goto LAB_00c98e0c;
                  auVar53 = minps(auVar53,auVar1);
                  auVar42 = maxps(auVar42,auVar1);
                  pauVar22 = (undefined1 (*) [16])(*pauVar22 + lVar19);
                  lVar14 = lVar14 + -1;
                } while (lVar14 != 0);
              }
              uVar18 = uVar18 + 1;
              auVar58 = auVar42;
              auVar64 = auVar53;
            } while (uVar18 != uVar15);
          }
LAB_00c98e0c:
          fVar40 = fVar40 - fVar29;
          if (fVar40 <= 0.0) {
            fVar40 = 0.0;
          }
          fVar29 = 1.0 - fVar40;
          auVar42._0_4_ = auVar34._0_4_ * fVar29 + auVar65._0_4_ * fVar40;
          auVar42._4_4_ = auVar34._4_4_ * fVar29 + auVar65._4_4_ * fVar40;
          auVar42._8_4_ = auVar34._8_4_ * fVar29 + auVar65._8_4_ * fVar40;
          auVar42._12_4_ = auVar34._12_4_ * fVar29 + auVar65._12_4_ * fVar40;
          fVar54 = fVar29 * auVar32._0_4_ + fVar40 * auVar43._0_4_;
          fVar55 = fVar29 * auVar32._4_4_ + fVar40 * auVar43._4_4_;
          fVar56 = fVar29 * auVar32._8_4_ + fVar40 * auVar43._8_4_;
          fVar40 = fVar29 * auVar32._12_4_ + fVar40 * auVar43._12_4_;
          fVar30 = fVar30 - fVar51;
          if (fVar30 <= 0.0) {
            fVar30 = 0.0;
          }
          fVar29 = 1.0 - fVar30;
          auVar43._0_4_ = auVar37._0_4_ * fVar29 + auVar64._0_4_ * fVar30;
          auVar43._4_4_ = auVar37._4_4_ * fVar29 + auVar64._4_4_ * fVar30;
          auVar43._8_4_ = auVar37._8_4_ * fVar29 + auVar64._8_4_ * fVar30;
          auVar43._12_4_ = auVar37._12_4_ * fVar29 + auVar64._12_4_ * fVar30;
          auVar64._0_4_ = fVar29 * auVar48._0_4_ + fVar30 * auVar58._0_4_;
          auVar64._4_4_ = fVar29 * auVar48._4_4_ + fVar30 * auVar58._4_4_;
          auVar64._8_4_ = fVar29 * auVar48._8_4_ + fVar30 * auVar58._8_4_;
          auVar64._12_4_ = fVar29 * auVar48._12_4_ + fVar30 * auVar58._12_4_;
          if ((int)(iVar21 + 1U) < iVar10) {
            uVar23 = (ulong)(iVar21 + 1U);
            do {
              auVar34 = _DAT_01f7aa00;
              auVar37 = _DAT_01f7a9f0;
              if (uVar16 < uVar2) {
                uVar3 = *(ushort *)(lVar6 + 8 + lVar25);
                uVar13 = (ulong)uVar3;
                if (uVar24 + 3 < (ulong)uVar3) {
                  uVar13 = uVar24 + 3;
                }
                uVar18 = uVar17;
                auVar32 = _DAT_01f7aa00;
                auVar48 = _DAT_01f7a9f0;
                do {
                  if (uVar26 < uVar3) {
                    uVar12 = *(ulong *)&pGVar5[2].numPrimitives;
                    lVar20 = *(long *)(uVar12 + 0x10 + uVar23 * 0x38);
                    pauVar22 = (undefined1 (*) [16])
                               ((*(uint *)(lVar6 + lVar25) + uVar24 +
                                *(uint *)(lVar6 + 4 + lVar25) * uVar18) * lVar20 +
                               *(long *)(uVar12 + uVar23 * 0x38));
                    lVar19 = uVar13 - uVar24;
                    do {
                      auVar58 = *pauVar22;
                      auVar53._0_4_ =
                           -(uint)(auVar58._0_4_ < 1.844e+18 && -1.844e+18 < auVar58._0_4_);
                      auVar53._4_4_ =
                           -(uint)(auVar58._4_4_ < 1.844e+18 && -1.844e+18 < auVar58._4_4_);
                      auVar53._8_4_ =
                           -(uint)(auVar58._8_4_ < 1.844e+18 && -1.844e+18 < auVar58._8_4_);
                      auVar53._12_4_ =
                           -(uint)(auVar58._12_4_ < 1.844e+18 && -1.844e+18 < auVar58._12_4_);
                      uVar11 = movmskps((int)uVar12,auVar53);
                      uVar12 = (ulong)CONCAT31((int3)((uint)uVar11 >> 8),~(byte)uVar11);
                      auVar34 = _DAT_01f7aa00;
                      auVar37 = _DAT_01f7a9f0;
                      if ((~(byte)uVar11 & 7) != 0) goto LAB_00c98f6d;
                      auVar48 = minps(auVar48,auVar58);
                      auVar32 = maxps(auVar32,auVar58);
                      pauVar22 = (undefined1 (*) [16])(*pauVar22 + lVar20);
                      lVar19 = lVar19 + -1;
                    } while (lVar19 != 0);
                  }
                  uVar18 = uVar18 + 1;
                  auVar34 = auVar32;
                  auVar37 = auVar48;
                } while (uVar18 != uVar15);
              }
LAB_00c98f6d:
              fVar52 = ((float)(int)uVar23 / fVar28 - fVar41) / (fVar36 - fVar41);
              fVar62 = 1.0 - fVar52;
              fVar51 = auVar43._4_4_;
              fVar46 = auVar43._12_4_;
              fVar67 = auVar43._8_4_;
              fVar30 = auVar42._4_4_;
              fVar29 = auVar42._12_4_;
              fVar69 = auVar42._8_4_;
              auVar48._0_4_ = auVar37._0_4_ - (auVar42._0_4_ * fVar62 + auVar43._0_4_ * fVar52);
              auVar48._4_4_ = auVar37._4_4_ - (fVar30 * fVar62 + fVar51 * fVar52);
              auVar48._8_4_ = auVar37._8_4_ - (fVar69 * fVar62 + fVar67 * fVar52);
              auVar48._12_4_ = auVar37._12_4_ - (fVar29 * fVar62 + fVar46 * fVar52);
              fVar59 = auVar64._4_4_;
              fVar60 = auVar64._8_4_;
              fVar61 = auVar64._12_4_;
              auVar32._0_4_ = auVar34._0_4_ - (fVar62 * fVar54 + fVar52 * auVar64._0_4_);
              auVar32._4_4_ = auVar34._4_4_ - (fVar62 * fVar55 + fVar52 * fVar59);
              auVar32._8_4_ = auVar34._8_4_ - (fVar62 * fVar56 + fVar52 * fVar60);
              auVar32._12_4_ = auVar34._12_4_ - (fVar62 * fVar40 + fVar52 * fVar61);
              auVar37 = minps(auVar48,ZEXT816(0));
              auVar34 = maxps(auVar32,ZEXT816(0));
              auVar42._0_4_ = auVar42._0_4_ + auVar37._0_4_;
              auVar42._4_4_ = fVar30 + auVar37._4_4_;
              auVar42._8_4_ = fVar69 + auVar37._8_4_;
              auVar42._12_4_ = fVar29 + auVar37._12_4_;
              auVar43._0_4_ = auVar43._0_4_ + auVar37._0_4_;
              auVar43._4_4_ = fVar51 + auVar37._4_4_;
              auVar43._8_4_ = fVar67 + auVar37._8_4_;
              auVar43._12_4_ = fVar46 + auVar37._12_4_;
              fVar54 = fVar54 + auVar34._0_4_;
              fVar55 = fVar55 + auVar34._4_4_;
              fVar56 = fVar56 + auVar34._8_4_;
              fVar40 = fVar40 + auVar34._12_4_;
              auVar64._0_4_ = auVar64._0_4_ + auVar34._0_4_;
              auVar64._4_4_ = fVar59 + auVar34._4_4_;
              auVar64._8_4_ = fVar60 + auVar34._8_4_;
              auVar64._12_4_ = fVar61 + auVar34._12_4_;
              uVar23 = uVar23 + 1;
            } while (iVar10 != (int)uVar23);
          }
        }
        else {
          if (iVar10 - iVar21 != 1) goto LAB_00c98e0c;
LAB_00c98c2c:
          fVar28 = fVar40 - fVar29;
          if (fVar40 - fVar29 <= 0.0) {
            fVar28 = 0.0;
          }
          fVar36 = 1.0 - fVar28;
          auVar42._4_4_ = fVar36 * auVar34._4_4_ + fVar28 * auVar37._4_4_;
          auVar42._0_4_ = fVar36 * auVar34._0_4_ + fVar28 * auVar37._0_4_;
          fVar54 = fVar36 * auVar32._0_4_ + fVar28 * auVar48._0_4_;
          fVar55 = fVar36 * auVar32._4_4_ + fVar28 * auVar48._4_4_;
          fVar56 = fVar36 * auVar32._8_4_ + fVar28 * auVar48._8_4_;
          fVar40 = fVar36 * auVar32._12_4_ + fVar28 * auVar48._12_4_;
          fVar29 = fVar30 - fVar51;
          if (fVar30 - fVar51 <= 0.0) {
            fVar29 = 0.0;
          }
          fVar30 = 1.0 - fVar29;
          auVar43._0_4_ = auVar37._0_4_ * fVar30 + auVar34._0_4_ * fVar29;
          auVar43._4_4_ = auVar37._4_4_ * fVar30 + auVar34._4_4_ * fVar29;
          auVar43._8_4_ = auVar37._8_4_ * fVar30 + auVar34._8_4_ * fVar29;
          auVar43._12_4_ = auVar37._12_4_ * fVar30 + auVar34._12_4_ * fVar29;
          auVar64._0_4_ = fVar30 * auVar48._0_4_ + fVar29 * auVar32._0_4_;
          auVar64._4_4_ = fVar30 * auVar48._4_4_ + fVar29 * auVar32._4_4_;
          auVar64._8_4_ = fVar30 * auVar48._8_4_ + fVar29 * auVar32._8_4_;
          auVar64._12_4_ = fVar30 * auVar48._12_4_ + fVar29 * auVar32._12_4_;
          auVar42._8_4_ = fVar36 * auVar34._8_4_ + fVar28 * auVar37._8_4_;
          auVar42._12_4_ = fVar36 * auVar34._12_4_ + fVar28 * auVar37._12_4_;
        }
        aVar31.m128 = (__m128)minps(this->bounds0[0].bounds0.lower.field_0,auVar42);
        auVar1._4_4_ = fVar55;
        auVar1._0_4_ = fVar54;
        auVar1._8_4_ = fVar56;
        auVar1._12_4_ = fVar40;
        aVar38.m128 = (__m128)maxps(this->bounds0[0].bounds0.upper.field_0,auVar1);
        aVar49.m128 = (__m128)minps(this->bounds0[0].bounds1.lower.field_0,auVar43);
        aVar44.m128 = (__m128)maxps(this->bounds0[0].bounds1.upper.field_0,auVar64);
        this->bounds0[0].bounds0.lower.field_0 = aVar31;
        this->bounds0[0].bounds0.upper.field_0 = aVar38;
        this->bounds0[0].bounds1.lower.field_0 = aVar49;
        this->bounds0[0].bounds1.upper.field_0 = aVar44;
        fVar36 = (float)(uint)prims[begin].lbounds.bounds1.upper.field_0.m128[3];
        fVar40 = prims[begin].time_range.lower;
        fVar29 = prims[begin].time_range.upper - fVar40;
        fVar30 = floorf(((fVar27 - fVar40) / fVar29) * 1.0000002 * fVar36);
        fVar28 = 0.0;
        if (0.0 <= fVar30) {
          fVar28 = fVar30;
        }
        fVar30 = ceilf(((fVar47 - fVar40) / fVar29) * 0.99999976 * fVar36);
        if (fVar36 <= fVar30) {
          fVar30 = fVar36;
        }
        this->count0[0] = this->count0[0] + (long)((int)fVar30 - (int)fVar28);
        fVar28 = prims[begin].time_range.upper * 0.9999;
      }
      if ((fVar47 < fVar28) && (prims[begin].time_range.lower * 1.0001 < fVar35)) {
        fVar28 = prims[begin].lbounds.bounds0.upper.field_0.m128[3];
        pSVar4 = recalculatePrimRef->sgrids;
        pGVar5 = (recalculatePrimRef->scene->geometries).items
                 [(uint)prims[begin].lbounds.bounds0.lower.field_0.m128[3]].ptr;
        uVar17 = (ulong)pSVar4[(uint)fVar28].sx & 0x7fff;
        uVar24 = (ulong)pSVar4[(uint)fVar28].sy & 0x7fff;
        lVar6 = *(long *)&pGVar5->field_0x58;
        lVar25 = (ulong)pSVar4[(uint)fVar28].primID *
                 pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
        fVar28 = pGVar5->fnumTimeSegments;
        fVar30 = (pGVar5->time_range).lower;
        fVar36 = (pGVar5->time_range).upper - fVar30;
        fVar41 = (fVar47 - fVar30) / fVar36;
        fVar36 = (fVar35 - fVar30) / fVar36;
        fVar40 = fVar28 * fVar41;
        fVar51 = fVar28 * fVar36;
        fVar29 = floorf(fVar40);
        fVar30 = ceilf(fVar51);
        iVar21 = (int)fVar29;
        if (fVar29 <= 0.0) {
          fVar29 = 0.0;
        }
        if (iVar21 < 0) {
          iVar21 = -1;
        }
        iVar10 = (int)fVar28 + 1;
        if ((int)fVar30 < (int)fVar28 + 1) {
          iVar10 = (int)fVar30;
        }
        if (fVar28 <= fVar30) {
          fVar30 = fVar28;
        }
        uVar2 = *(ushort *)(lVar6 + 10 + lVar25);
        uVar15 = (ulong)uVar2;
        if (uVar24 + 3 < (ulong)uVar2) {
          uVar15 = uVar24 + 3;
        }
        uVar26 = (ushort)uVar24;
        uVar16 = (ushort)uVar17;
        auVar34 = _DAT_01f7a9f0;
        auVar37 = _DAT_01f7a9f0;
        auVar32 = _DAT_01f7aa00;
        auVar48 = _DAT_01f7aa00;
        auVar43 = _DAT_01f7aa00;
        auVar65 = _DAT_01f7a9f0;
        auVar58 = _DAT_01f7aa00;
        auVar64 = _DAT_01f7a9f0;
        if (uVar26 < uVar2) {
          uVar23 = uVar17 + 3;
          uVar3 = *(ushort *)(lVar6 + 8 + lVar25);
          uVar13 = (ulong)uVar3;
          if (uVar23 < uVar3) {
            uVar13 = uVar23;
          }
          uVar18 = uVar24;
          do {
            if (uVar16 < uVar3) {
              lVar19 = (long)(int)fVar29 * 0x38;
              lVar20 = *(long *)(*(long *)&pGVar5[2].numPrimitives + 0x10 + lVar19);
              uVar12 = *(uint *)(lVar6 + 4 + lVar25) * uVar18;
              pauVar22 = (undefined1 (*) [16])
                         ((*(uint *)(lVar6 + lVar25) + uVar17 + uVar12) * lVar20 +
                         *(long *)(*(long *)&pGVar5[2].numPrimitives + lVar19));
              lVar19 = uVar13 - uVar17;
              do {
                auVar42 = *pauVar22;
                auVar7._4_4_ = -(uint)(auVar42._4_4_ < 1.844e+18 && -1.844e+18 < auVar42._4_4_);
                auVar7._0_4_ = -(uint)(auVar42._0_4_ < 1.844e+18 && -1.844e+18 < auVar42._0_4_);
                auVar7._8_4_ = -(uint)(auVar42._8_4_ < 1.844e+18 && -1.844e+18 < auVar42._8_4_);
                auVar7._12_4_ = -(uint)(auVar42._12_4_ < 1.844e+18 && -1.844e+18 < auVar42._12_4_);
                uVar11 = movmskps((int)uVar12,auVar7);
                uVar12 = (ulong)CONCAT31((int3)((uint)uVar11 >> 8),~(byte)uVar11);
                auVar34 = _DAT_01f7a9f0;
                auVar32 = _DAT_01f7aa00;
                if ((~(byte)uVar11 & 7) != 0) goto LAB_00c99364;
                auVar37 = minps(auVar37,auVar42);
                auVar48 = maxps(auVar48,auVar42);
                pauVar22 = (undefined1 (*) [16])(*pauVar22 + lVar20);
                lVar19 = lVar19 + -1;
              } while (lVar19 != 0);
            }
            uVar18 = uVar18 + 1;
            auVar34 = auVar37;
            auVar32 = auVar48;
          } while (uVar18 != uVar15);
LAB_00c99364:
          lVar20 = (long)(int)fVar30 * 0x38;
          uVar18 = uVar24;
          auVar42 = _DAT_01f7a9f0;
          auVar53 = _DAT_01f7aa00;
          do {
            if (uVar16 < uVar3) {
              lVar19 = *(long *)(*(long *)&pGVar5[2].numPrimitives + 0x10 + lVar20);
              uVar12 = *(uint *)(lVar6 + 4 + lVar25) * uVar18;
              pauVar22 = (undefined1 (*) [16])
                         ((*(uint *)(lVar6 + lVar25) + uVar17 + uVar12) * lVar19 +
                         *(long *)(*(long *)&pGVar5[2].numPrimitives + lVar20));
              lVar14 = uVar13 - uVar17;
              do {
                auVar1 = *pauVar22;
                auVar63._0_4_ = -(uint)(auVar1._0_4_ < 1.844e+18 && -1.844e+18 < auVar1._0_4_);
                auVar63._4_4_ = -(uint)(auVar1._4_4_ < 1.844e+18 && -1.844e+18 < auVar1._4_4_);
                auVar63._8_4_ = -(uint)(auVar1._8_4_ < 1.844e+18 && -1.844e+18 < auVar1._8_4_);
                auVar63._12_4_ = -(uint)(auVar1._12_4_ < 1.844e+18 && -1.844e+18 < auVar1._12_4_);
                uVar11 = movmskps((int)uVar12,auVar63);
                uVar12 = (ulong)CONCAT31((int3)((uint)uVar11 >> 8),~(byte)uVar11);
                auVar37 = _DAT_01f7a9f0;
                auVar48 = _DAT_01f7aa00;
                if ((~(byte)uVar11 & 7) != 0) goto LAB_00c993e9;
                auVar42 = minps(auVar42,auVar1);
                auVar53 = maxps(auVar53,auVar1);
                pauVar22 = (undefined1 (*) [16])(*pauVar22 + lVar19);
                lVar14 = lVar14 + -1;
              } while (lVar14 != 0);
            }
            uVar18 = uVar18 + 1;
            auVar37 = auVar42;
            auVar48 = auVar53;
          } while (uVar18 != uVar15);
LAB_00c993e9:
          if (iVar10 - iVar21 == 1) goto LAB_00c993fc;
          if (uVar26 < uVar2) {
            uVar3 = *(ushort *)(lVar6 + 8 + lVar25);
            uVar13 = (ulong)uVar3;
            if (uVar23 < uVar3) {
              uVar13 = uVar23;
            }
            uVar23 = uVar24;
            do {
              uVar18 = uVar24;
              auVar42 = _DAT_01f7aa00;
              auVar53 = _DAT_01f7a9f0;
              if (uVar16 < uVar3) {
                lVar14 = (long)(int)fVar29 * 0x38;
                lVar19 = *(long *)(*(long *)&pGVar5[2].numPrimitives + 0x48 + lVar14);
                uVar12 = *(uint *)(lVar6 + 4 + lVar25) * uVar23;
                pauVar22 = (undefined1 (*) [16])
                           ((*(uint *)(lVar6 + lVar25) + uVar17 + uVar12) * lVar19 +
                           *(long *)(*(long *)&pGVar5[2].numPrimitives + 0x38 + lVar14));
                lVar14 = uVar13 - uVar17;
                do {
                  auVar1 = *pauVar22;
                  auVar68._0_4_ = -(uint)(auVar1._0_4_ < 1.844e+18 && -1.844e+18 < auVar1._0_4_);
                  auVar68._4_4_ = -(uint)(auVar1._4_4_ < 1.844e+18 && -1.844e+18 < auVar1._4_4_);
                  auVar68._8_4_ = -(uint)(auVar1._8_4_ < 1.844e+18 && -1.844e+18 < auVar1._8_4_);
                  auVar68._12_4_ = -(uint)(auVar1._12_4_ < 1.844e+18 && -1.844e+18 < auVar1._12_4_);
                  uVar11 = movmskps((int)uVar12,auVar68);
                  uVar12 = (ulong)CONCAT31((int3)((uint)uVar11 >> 8),~(byte)uVar11);
                  auVar65 = _DAT_01f7a9f0;
                  auVar43 = _DAT_01f7aa00;
                  if ((~(byte)uVar11 & 7) != 0) goto LAB_00c9954c;
                  auVar64 = minps(auVar64,auVar1);
                  auVar58 = maxps(auVar58,auVar1);
                  pauVar22 = (undefined1 (*) [16])(*pauVar22 + lVar19);
                  lVar14 = lVar14 + -1;
                } while (lVar14 != 0);
              }
              uVar23 = uVar23 + 1;
              auVar65 = auVar64;
              auVar43 = auVar58;
            } while (uVar23 != uVar15);
LAB_00c9954c:
            do {
              if (uVar16 < uVar3) {
                lVar19 = *(long *)(*(long *)&pGVar5[2].numPrimitives + -0x28 + lVar20);
                uVar23 = *(uint *)(lVar6 + 4 + lVar25) * uVar18;
                pauVar22 = (undefined1 (*) [16])
                           ((*(uint *)(lVar6 + lVar25) + uVar17 + uVar23) * lVar19 +
                           *(long *)(*(long *)&pGVar5[2].numPrimitives + -0x38 + lVar20));
                lVar14 = uVar13 - uVar17;
                do {
                  auVar1 = *pauVar22;
                  auVar9._4_4_ = -(uint)(auVar1._4_4_ < 1.844e+18 && -1.844e+18 < auVar1._4_4_);
                  auVar9._0_4_ = -(uint)(auVar1._0_4_ < 1.844e+18 && -1.844e+18 < auVar1._0_4_);
                  auVar9._8_4_ = -(uint)(auVar1._8_4_ < 1.844e+18 && -1.844e+18 < auVar1._8_4_);
                  auVar9._12_4_ = -(uint)(auVar1._12_4_ < 1.844e+18 && -1.844e+18 < auVar1._12_4_);
                  uVar11 = movmskps((int)uVar23,auVar9);
                  uVar23 = (ulong)CONCAT31((int3)((uint)uVar11 >> 8),~(byte)uVar11);
                  auVar58 = _DAT_01f7aa00;
                  auVar64 = _DAT_01f7a9f0;
                  if ((~(byte)uVar11 & 7) != 0) goto LAB_00c995dd;
                  auVar53 = minps(auVar53,auVar1);
                  auVar42 = maxps(auVar42,auVar1);
                  pauVar22 = (undefined1 (*) [16])(*pauVar22 + lVar19);
                  lVar14 = lVar14 + -1;
                } while (lVar14 != 0);
              }
              uVar18 = uVar18 + 1;
              auVar58 = auVar42;
              auVar64 = auVar53;
            } while (uVar18 != uVar15);
          }
LAB_00c995dd:
          fVar40 = fVar40 - fVar29;
          if (fVar40 <= 0.0) {
            fVar40 = 0.0;
          }
          fVar29 = 1.0 - fVar40;
          auVar39._0_4_ = auVar34._0_4_ * fVar29 + auVar65._0_4_ * fVar40;
          auVar39._4_4_ = auVar34._4_4_ * fVar29 + auVar65._4_4_ * fVar40;
          auVar39._8_4_ = auVar34._8_4_ * fVar29 + auVar65._8_4_ * fVar40;
          auVar39._12_4_ = auVar34._12_4_ * fVar29 + auVar65._12_4_ * fVar40;
          fVar54 = fVar29 * auVar32._0_4_ + fVar40 * auVar43._0_4_;
          fVar55 = fVar29 * auVar32._4_4_ + fVar40 * auVar43._4_4_;
          fVar56 = fVar29 * auVar32._8_4_ + fVar40 * auVar43._8_4_;
          fVar40 = fVar29 * auVar32._12_4_ + fVar40 * auVar43._12_4_;
          fVar30 = fVar30 - fVar51;
          if (fVar30 <= 0.0) {
            fVar30 = 0.0;
          }
          fVar29 = 1.0 - fVar30;
          auVar45._0_4_ = auVar37._0_4_ * fVar29 + auVar64._0_4_ * fVar30;
          auVar45._4_4_ = auVar37._4_4_ * fVar29 + auVar64._4_4_ * fVar30;
          auVar45._8_4_ = auVar37._8_4_ * fVar29 + auVar64._8_4_ * fVar30;
          auVar45._12_4_ = auVar37._12_4_ * fVar29 + auVar64._12_4_ * fVar30;
          auVar57._0_4_ = fVar29 * auVar48._0_4_ + fVar30 * auVar58._0_4_;
          auVar57._4_4_ = fVar29 * auVar48._4_4_ + fVar30 * auVar58._4_4_;
          auVar57._8_4_ = fVar29 * auVar48._8_4_ + fVar30 * auVar58._8_4_;
          auVar57._12_4_ = fVar29 * auVar48._12_4_ + fVar30 * auVar58._12_4_;
          if ((int)(iVar21 + 1U) < iVar10) {
            uVar23 = (ulong)(iVar21 + 1U);
            do {
              auVar34 = _DAT_01f7aa00;
              auVar37 = _DAT_01f7a9f0;
              if (uVar26 < uVar2) {
                uVar3 = *(ushort *)(lVar6 + 8 + lVar25);
                uVar13 = (ulong)uVar3;
                if (uVar17 + 3 < (ulong)uVar3) {
                  uVar13 = uVar17 + 3;
                }
                uVar18 = uVar24;
                auVar32 = _DAT_01f7aa00;
                auVar48 = _DAT_01f7a9f0;
                do {
                  if (uVar16 < uVar3) {
                    uVar12 = *(ulong *)&pGVar5[2].numPrimitives;
                    lVar20 = *(long *)(uVar12 + 0x10 + uVar23 * 0x38);
                    pauVar22 = (undefined1 (*) [16])
                               ((*(uint *)(lVar6 + lVar25) + uVar17 +
                                *(uint *)(lVar6 + 4 + lVar25) * uVar18) * lVar20 +
                               *(long *)(uVar12 + uVar23 * 0x38));
                    lVar19 = uVar13 - uVar17;
                    do {
                      auVar58 = *pauVar22;
                      auVar66._0_4_ =
                           -(uint)(auVar58._0_4_ < 1.844e+18 && -1.844e+18 < auVar58._0_4_);
                      auVar66._4_4_ =
                           -(uint)(auVar58._4_4_ < 1.844e+18 && -1.844e+18 < auVar58._4_4_);
                      auVar66._8_4_ =
                           -(uint)(auVar58._8_4_ < 1.844e+18 && -1.844e+18 < auVar58._8_4_);
                      auVar66._12_4_ =
                           -(uint)(auVar58._12_4_ < 1.844e+18 && -1.844e+18 < auVar58._12_4_);
                      uVar11 = movmskps((int)uVar12,auVar66);
                      uVar12 = (ulong)CONCAT31((int3)((uint)uVar11 >> 8),~(byte)uVar11);
                      auVar34 = _DAT_01f7aa00;
                      auVar37 = _DAT_01f7a9f0;
                      if ((~(byte)uVar11 & 7) != 0) goto LAB_00c99741;
                      auVar48 = minps(auVar48,auVar58);
                      auVar32 = maxps(auVar32,auVar58);
                      pauVar22 = (undefined1 (*) [16])(*pauVar22 + lVar20);
                      lVar19 = lVar19 + -1;
                    } while (lVar19 != 0);
                  }
                  uVar18 = uVar18 + 1;
                  auVar34 = auVar32;
                  auVar37 = auVar48;
                } while (uVar18 != uVar15);
              }
LAB_00c99741:
              fVar52 = ((float)(int)uVar23 / fVar28 - fVar41) / (fVar36 - fVar41);
              fVar62 = 1.0 - fVar52;
              fVar51 = auVar45._4_4_;
              fVar46 = auVar45._12_4_;
              fVar67 = auVar45._8_4_;
              fVar30 = auVar39._4_4_;
              fVar29 = auVar39._12_4_;
              fVar69 = auVar39._8_4_;
              auVar50._0_4_ = auVar37._0_4_ - (auVar39._0_4_ * fVar62 + auVar45._0_4_ * fVar52);
              auVar50._4_4_ = auVar37._4_4_ - (fVar30 * fVar62 + fVar51 * fVar52);
              auVar50._8_4_ = auVar37._8_4_ - (fVar69 * fVar62 + fVar67 * fVar52);
              auVar50._12_4_ = auVar37._12_4_ - (fVar29 * fVar62 + fVar46 * fVar52);
              fVar59 = auVar57._4_4_;
              fVar60 = auVar57._8_4_;
              fVar61 = auVar57._12_4_;
              auVar33._0_4_ = auVar34._0_4_ - (fVar62 * fVar54 + fVar52 * auVar57._0_4_);
              auVar33._4_4_ = auVar34._4_4_ - (fVar62 * fVar55 + fVar52 * fVar59);
              auVar33._8_4_ = auVar34._8_4_ - (fVar62 * fVar56 + fVar52 * fVar60);
              auVar33._12_4_ = auVar34._12_4_ - (fVar62 * fVar40 + fVar52 * fVar61);
              auVar37 = minps(auVar50,ZEXT816(0));
              auVar34 = maxps(auVar33,ZEXT816(0));
              auVar39._0_4_ = auVar39._0_4_ + auVar37._0_4_;
              auVar39._4_4_ = fVar30 + auVar37._4_4_;
              auVar39._8_4_ = fVar69 + auVar37._8_4_;
              auVar39._12_4_ = fVar29 + auVar37._12_4_;
              auVar45._0_4_ = auVar45._0_4_ + auVar37._0_4_;
              auVar45._4_4_ = fVar51 + auVar37._4_4_;
              auVar45._8_4_ = fVar67 + auVar37._8_4_;
              auVar45._12_4_ = fVar46 + auVar37._12_4_;
              fVar54 = fVar54 + auVar34._0_4_;
              fVar55 = fVar55 + auVar34._4_4_;
              fVar56 = fVar56 + auVar34._8_4_;
              fVar40 = fVar40 + auVar34._12_4_;
              auVar57._0_4_ = auVar57._0_4_ + auVar34._0_4_;
              auVar57._4_4_ = fVar59 + auVar34._4_4_;
              auVar57._8_4_ = fVar60 + auVar34._8_4_;
              auVar57._12_4_ = fVar61 + auVar34._12_4_;
              uVar23 = uVar23 + 1;
            } while (iVar10 != (int)uVar23);
          }
        }
        else {
          if (iVar10 - iVar21 != 1) goto LAB_00c995dd;
LAB_00c993fc:
          fVar28 = fVar40 - fVar29;
          if (fVar40 - fVar29 <= 0.0) {
            fVar28 = 0.0;
          }
          fVar36 = 1.0 - fVar28;
          auVar39._4_4_ = fVar36 * auVar34._4_4_ + fVar28 * auVar37._4_4_;
          auVar39._0_4_ = fVar36 * auVar34._0_4_ + fVar28 * auVar37._0_4_;
          fVar54 = fVar36 * auVar32._0_4_ + fVar28 * auVar48._0_4_;
          fVar55 = fVar36 * auVar32._4_4_ + fVar28 * auVar48._4_4_;
          fVar56 = fVar36 * auVar32._8_4_ + fVar28 * auVar48._8_4_;
          fVar40 = fVar36 * auVar32._12_4_ + fVar28 * auVar48._12_4_;
          fVar29 = fVar30 - fVar51;
          if (fVar30 - fVar51 <= 0.0) {
            fVar29 = 0.0;
          }
          fVar30 = 1.0 - fVar29;
          auVar45._0_4_ = auVar37._0_4_ * fVar30 + auVar34._0_4_ * fVar29;
          auVar45._4_4_ = auVar37._4_4_ * fVar30 + auVar34._4_4_ * fVar29;
          auVar45._8_4_ = auVar37._8_4_ * fVar30 + auVar34._8_4_ * fVar29;
          auVar45._12_4_ = auVar37._12_4_ * fVar30 + auVar34._12_4_ * fVar29;
          auVar57._0_4_ = fVar30 * auVar48._0_4_ + fVar29 * auVar32._0_4_;
          auVar57._4_4_ = fVar30 * auVar48._4_4_ + fVar29 * auVar32._4_4_;
          auVar57._8_4_ = fVar30 * auVar48._8_4_ + fVar29 * auVar32._8_4_;
          auVar57._12_4_ = fVar30 * auVar48._12_4_ + fVar29 * auVar32._12_4_;
          auVar39._8_4_ = fVar36 * auVar34._8_4_ + fVar28 * auVar37._8_4_;
          auVar39._12_4_ = fVar36 * auVar34._12_4_ + fVar28 * auVar37._12_4_;
        }
        aVar31.m128 = (__m128)minps(this->bounds1[0].bounds0.lower.field_0,auVar39);
        auVar8._4_4_ = fVar55;
        auVar8._0_4_ = fVar54;
        auVar8._8_4_ = fVar56;
        auVar8._12_4_ = fVar40;
        aVar38.m128 = (__m128)maxps(this->bounds1[0].bounds0.upper.field_0,auVar8);
        aVar49.m128 = (__m128)minps(this->bounds1[0].bounds1.lower.field_0,auVar45);
        aVar44.m128 = (__m128)maxps(this->bounds1[0].bounds1.upper.field_0,auVar57);
        this->bounds1[0].bounds0.lower.field_0 = aVar31;
        this->bounds1[0].bounds0.upper.field_0 = aVar38;
        this->bounds1[0].bounds1.lower.field_0 = aVar49;
        this->bounds1[0].bounds1.upper.field_0 = aVar44;
        fVar36 = (float)(uint)prims[begin].lbounds.bounds1.upper.field_0.m128[3];
        fVar40 = prims[begin].time_range.lower;
        fVar29 = prims[begin].time_range.upper - fVar40;
        fVar30 = floorf(((fVar47 - fVar40) / fVar29) * 1.0000002 * fVar36);
        fVar28 = 0.0;
        if (0.0 <= fVar30) {
          fVar28 = fVar30;
        }
        fVar30 = ceilf(((fVar35 - fVar40) / fVar29) * 0.99999976 * fVar36);
        if (fVar36 <= fVar30) {
          fVar30 = fVar36;
        }
        this->count1[0] = this->count1[0] + (long)((int)fVar30 - (int)fVar28);
      }
      begin = begin + 1;
    } while (begin != end);
  }
  return;
}

Assistant:

void bin(const PrimRefMB* prims, size_t begin, size_t end, BBox1f time_range, const SetMB& set, const RecalculatePrimRef& recalculatePrimRef)
          {
            for (int b=0; b<BINS-1; b++)
            {
              const float t = float(b+1)/float(BINS);
              const float ct = lerp(time_range.lower,time_range.upper,t);
              const float center_time = set.align_time(ct);
              if (center_time <= time_range.lower) continue;
              if (center_time >= time_range.upper) continue;
              const BBox1f dt0(time_range.lower,center_time);
              const BBox1f dt1(center_time,time_range.upper);
              
              /* find linear bounds for both time segments */
              for (size_t i=begin; i<end; i++) 
              {
                if (prims[i].time_range_overlap(dt0))
                {
                  const LBBox3fa bn0 = recalculatePrimRef.linearBounds(prims[i],dt0);
#if MBLUR_BIN_LBBOX
                  bounds0[b].extend(bn0);
#else
                  bounds0[b].extend(bn0.interpolate(0.5f));
#endif
                  count0[b] += prims[i].timeSegmentRange(dt0).size();
                }

                if (prims[i].time_range_overlap(dt1))
                {
                  const LBBox3fa bn1 = recalculatePrimRef.linearBounds(prims[i],dt1);
#if MBLUR_BIN_LBBOX
                  bounds1[b].extend(bn1);
#else
                  bounds1[b].extend(bn1.interpolate(0.5f));
#endif
                  count1[b] += prims[i].timeSegmentRange(dt1).size();
                }
              }
            }
          }